

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ilist.h
# Opt level: O1

iterator __thiscall
llvm::
simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
::
eraseAndDispose<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Disposer>
          (simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
           *this,iterator I,Disposer dispose)

{
  ilist_node_base<false> *piVar1;
  ilist_node_base<false> *piVar2;
  ilist_node_base<false> *piVar3;
  ilist_node_base<false> **ppiVar4;
  
  if ((simple_ilist<llvm::AllocatorList<llvm::yaml::Token,llvm::BumpPtrAllocatorImpl<llvm::MallocAllocator,4096ul,4096ul>>::Node>
       *)I.NodePtr != this) {
    piVar1 = ((I.NodePtr)->super_node_base_type).Next;
    piVar2 = ((I.NodePtr)->super_node_base_type).Prev;
    piVar3 = ((I.NodePtr)->super_node_base_type).Next;
    piVar3->Prev = piVar2;
    piVar2->Next = piVar3;
    ((I.NodePtr)->super_node_base_type).Prev = (ilist_node_base<false> *)0x0;
    ((I.NodePtr)->super_node_base_type).Next = (ilist_node_base<false> *)0x0;
    piVar2 = I.NodePtr[2].super_node_base_type.Next;
    ppiVar4 = &I.NodePtr[3].super_node_base_type.Next;
    if (piVar2 != (ilist_node_base<false> *)ppiVar4) {
      operator_delete(piVar2,(ulong)((long)&(*ppiVar4)->Prev + 1));
    }
    return (iterator)(node_pointer)piVar1;
  }
  __assert_fail("I != end() && \"Cannot remove end of list!\"",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/simple_ilist.h"
                ,0xc6,
                "iterator llvm::simple_ilist<llvm::AllocatorList<llvm::yaml::Token, llvm::BumpPtrAllocatorImpl<>>::Node>::erase(iterator) [T = llvm::AllocatorList<llvm::yaml::Token, llvm::BumpPtrAllocatorImpl<>>::Node, Options = <>]"
               );
}

Assistant:

void pop_front() { erase(begin()); }